

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O3

SQInteger __thiscall SQLexer::ReadString(SQLexer *this,SQInteger ndelim,bool verbatim,bool advance)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  DiagnosticsId diagId;
  long lVar8;
  uint uVar9;
  SQUnsignedInteger SVar10;
  LexChar LVar11;
  SQInteger SVar12;
  SQChar temp [9];
  SQChar *stemp;
  char *local_48 [2];
  char *local_38;
  
  if ((ndelim != 0x22) && (this->_state == LS_TEMPALTE)) {
    iVar2 = (int)this->_tokencolumn;
    SQCompilation::SQCompilationContext::reportDiagnostic
              (this->_ctx,DI_EXPECTED_LEX,(int32_t)this->_tokenline,iVar2,
               (int)this->_currentcolumn - iVar2,"string");
    return -1;
  }
  local_48[0]._0_1_ = '\0';
  sqvector<char,_unsigned_int>::resize(&this->_longstr,0,(char *)local_48);
  if (advance) {
    uVar6 = this->_sourceTextPtr;
    if (uVar6 < this->_sourceTextSize) {
      this->_sourceTextPtr = uVar6 + 1;
      uVar6 = (ulong)(byte)this->_sourceText[uVar6];
    }
    else {
      this->_reached_eof = 1;
      uVar6 = 0;
    }
    this->_currdata = (LexChar)uVar6;
    this->_currentcolumn = this->_currentcolumn + 1;
  }
  else {
    uVar6 = (ulong)this->_currdata;
  }
  if ((char)uVar6 == '\0') {
    return -1;
  }
  SVar12 = 0x103;
joined_r0x00136284:
  while (uVar6 == ndelim) {
    uVar6 = this->_sourceTextPtr;
    if (uVar6 < this->_sourceTextSize) {
      this->_sourceTextPtr = uVar6 + 1;
      LVar11 = this->_sourceText[uVar6];
    }
    else {
      this->_reached_eof = 1;
      LVar11 = '\0';
    }
    this->_currdata = LVar11;
    this->_currentcolumn = this->_currentcolumn + 1;
    if (this->_state == LS_TEMPALTE) {
      SVar12 = 0x153;
    }
    if ((!verbatim) || (LVar11 != '\"')) goto LAB_00136c61;
    uVar3 = (this->_longstr)._allocated;
    uVar9 = (this->_longstr)._size;
    pcVar7 = (this->_longstr)._vals;
    if (uVar3 <= uVar9) {
      uVar5 = uVar9 * 2;
      if (uVar9 * 2 == 0) {
        uVar5 = 4;
      }
      pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar7,(ulong)uVar3,(ulong)uVar5);
      (this->_longstr)._vals = pcVar7;
      (this->_longstr)._allocated = uVar5;
      uVar9 = (this->_longstr)._size;
    }
    (this->_longstr)._size = uVar9 + 1;
    pcVar7[uVar9] = '\"';
    uVar6 = this->_sourceTextPtr;
    if (uVar6 < this->_sourceTextSize) {
      this->_sourceTextPtr = uVar6 + 1;
      uVar6 = (ulong)(byte)this->_sourceText[uVar6];
    }
    else {
      this->_reached_eof = 1;
      uVar6 = 0;
    }
    this->_currdata = (LexChar)uVar6;
    this->_currentcolumn = this->_currentcolumn + 1;
  }
  uVar3 = (uint)uVar6;
  if (uVar3 < 0x5c) {
    if (uVar3 != 10) {
      if (uVar6 == 0) {
        iVar2 = (int)this->_tokencolumn;
        SQCompilation::SQCompilationContext::reportDiagnostic
                  (this->_ctx,DI_UNFINISHED_STRING,(int32_t)this->_tokenline,iVar2,
                   (int)this->_currentcolumn - iVar2);
        return -1;
      }
      goto LAB_00136401;
    }
    LVar11 = '\n';
    if (!verbatim) {
      iVar2 = (int)this->_tokencolumn;
      SQCompilation::SQCompilationContext::reportDiagnostic
                (this->_ctx,DI_NEWLINE_IN_CONST,(int32_t)this->_tokenline,iVar2,
                 (int)this->_currentcolumn - iVar2);
      LVar11 = this->_currdata;
    }
    uVar3 = (this->_longstr)._allocated;
    uVar9 = (this->_longstr)._size;
    pcVar7 = (this->_longstr)._vals;
    if (uVar3 <= uVar9) {
      uVar5 = uVar9 * 2;
      if (uVar9 * 2 == 0) {
        uVar5 = 4;
      }
      pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar7,(ulong)uVar3,(ulong)uVar5);
      (this->_longstr)._vals = pcVar7;
      (this->_longstr)._allocated = uVar5;
      uVar9 = (this->_longstr)._size;
    }
    (this->_longstr)._size = uVar9 + 1;
    pcVar7[uVar9] = LVar11;
    uVar6 = this->_sourceTextPtr;
    if (uVar6 < this->_sourceTextSize) {
      this->_sourceTextPtr = uVar6 + 1;
      LVar11 = this->_sourceText[uVar6];
    }
    else {
      this->_reached_eof = 1;
      LVar11 = '\0';
    }
    this->_currdata = LVar11;
    this->_currentcolumn = this->_currentcolumn + 1;
    this->_currentline = this->_currentline + 1;
    if (this->_comments != (Comments *)0x0) {
      SQCompilation::Comments::pushNewLine(this->_comments);
    }
LAB_0013648e:
    uVar6 = (ulong)this->_currdata;
    goto joined_r0x00136284;
  }
  if (uVar3 == 0x5c) {
    if (verbatim) {
LAB_00136399:
      uVar3 = (this->_longstr)._allocated;
      uVar9 = (this->_longstr)._size;
      pcVar7 = (this->_longstr)._vals;
      if (uVar3 <= uVar9) {
        uVar5 = uVar9 * 2;
        if (uVar9 * 2 == 0) {
          uVar5 = 4;
        }
        pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar7,(ulong)uVar3,(ulong)uVar5)
        ;
        (this->_longstr)._vals = pcVar7;
        (this->_longstr)._allocated = uVar5;
        uVar9 = (this->_longstr)._size;
      }
      (this->_longstr)._size = uVar9 + 1;
      pcVar7[uVar9] = '\\';
      goto LAB_0013645f;
    }
    uVar6 = this->_sourceTextPtr;
    if (this->_sourceTextSize <= uVar6) {
      this->_reached_eof = 1;
      this->_currdata = '\0';
      lVar8 = this->_currentcolumn + 1;
      this->_currentcolumn = lVar8;
      goto switchD_001365ef_caseD_6f;
    }
    this->_sourceTextPtr = uVar6 + 1;
    bVar1 = this->_sourceText[uVar6];
    this->_currdata = bVar1;
    lVar8 = this->_currentcolumn + 1;
    this->_currentcolumn = lVar8;
    if (bVar1 < 0x62) {
      if (bVar1 < 0x55) {
        if (bVar1 == 0x22) {
          uVar3 = (this->_longstr)._allocated;
          uVar9 = (this->_longstr)._size;
          pcVar7 = (this->_longstr)._vals;
          if (uVar3 <= uVar9) {
            uVar5 = uVar9 * 2;
            if (uVar9 * 2 == 0) {
              uVar5 = 4;
            }
            pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar7,(ulong)uVar3,
                                           (ulong)uVar5);
            (this->_longstr)._vals = pcVar7;
            (this->_longstr)._allocated = uVar5;
            uVar9 = (this->_longstr)._size;
          }
          (this->_longstr)._size = uVar9 + 1;
          pcVar7[uVar9] = '\"';
        }
        else if (bVar1 == 0x27) {
          uVar3 = (this->_longstr)._allocated;
          uVar9 = (this->_longstr)._size;
          pcVar7 = (this->_longstr)._vals;
          if (uVar3 <= uVar9) {
            uVar5 = uVar9 * 2;
            if (uVar9 * 2 == 0) {
              uVar5 = 4;
            }
            pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar7,(ulong)uVar3,
                                           (ulong)uVar5);
            (this->_longstr)._vals = pcVar7;
            (this->_longstr)._allocated = uVar5;
            uVar9 = (this->_longstr)._size;
          }
          (this->_longstr)._size = uVar9 + 1;
          pcVar7[uVar9] = '\'';
        }
        else {
          if (bVar1 != 0x30) goto switchD_001365ef_caseD_6f;
          uVar3 = (this->_longstr)._allocated;
          uVar9 = (this->_longstr)._size;
          pcVar7 = (this->_longstr)._vals;
          if (uVar3 <= uVar9) {
            uVar5 = uVar9 * 2;
            if (uVar9 * 2 == 0) {
              uVar5 = 4;
            }
            pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar7,(ulong)uVar3,
                                           (ulong)uVar5);
            (this->_longstr)._vals = pcVar7;
            (this->_longstr)._allocated = uVar5;
            uVar9 = (this->_longstr)._size;
          }
          (this->_longstr)._size = uVar9 + 1;
          pcVar7[uVar9] = '\0';
        }
      }
      else {
        if (bVar1 == 0x55) goto switchD_001365ef_caseD_75;
        if (bVar1 == 0x5c) goto LAB_00136399;
        if (bVar1 != 0x61) goto switchD_001365ef_caseD_6f;
        uVar3 = (this->_longstr)._allocated;
        uVar9 = (this->_longstr)._size;
        pcVar7 = (this->_longstr)._vals;
        if (uVar3 <= uVar9) {
          uVar5 = uVar9 * 2;
          if (uVar9 * 2 == 0) {
            uVar5 = 4;
          }
          pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar7,(ulong)uVar3,
                                         (ulong)uVar5);
          (this->_longstr)._vals = pcVar7;
          (this->_longstr)._allocated = uVar5;
          uVar9 = (this->_longstr)._size;
        }
        (this->_longstr)._size = uVar9 + 1;
        pcVar7[uVar9] = '\a';
      }
    }
    else {
      switch(bVar1) {
      case 0x6e:
        uVar3 = (this->_longstr)._allocated;
        uVar9 = (this->_longstr)._size;
        pcVar7 = (this->_longstr)._vals;
        if (uVar3 <= uVar9) {
          uVar5 = uVar9 * 2;
          if (uVar9 * 2 == 0) {
            uVar5 = 4;
          }
          pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar7,(ulong)uVar3,
                                         (ulong)uVar5);
          (this->_longstr)._vals = pcVar7;
          (this->_longstr)._allocated = uVar5;
          uVar9 = (this->_longstr)._size;
        }
        (this->_longstr)._size = uVar9 + 1;
        pcVar7[uVar9] = '\n';
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
      case 0x77:
      case 0x79:
      case 0x7a:
      case 0x7c:
switchD_001365ef_caseD_6f:
        iVar2 = (int)this->_tokencolumn;
        SQCompilation::SQCompilationContext::reportDiagnostic
                  (this->_ctx,DI_UNRECOGNISED_ESCAPER,(int32_t)this->_tokenline,iVar2,
                   (int)lVar8 - iVar2);
        goto LAB_0013648e;
      case 0x72:
        uVar3 = (this->_longstr)._allocated;
        uVar9 = (this->_longstr)._size;
        pcVar7 = (this->_longstr)._vals;
        if (uVar3 <= uVar9) {
          uVar5 = uVar9 * 2;
          if (uVar9 * 2 == 0) {
            uVar5 = 4;
          }
          pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar7,(ulong)uVar3,
                                         (ulong)uVar5);
          (this->_longstr)._vals = pcVar7;
          (this->_longstr)._allocated = uVar5;
          uVar9 = (this->_longstr)._size;
        }
        (this->_longstr)._size = uVar9 + 1;
        pcVar7[uVar9] = '\r';
        break;
      case 0x74:
        uVar3 = (this->_longstr)._allocated;
        uVar9 = (this->_longstr)._size;
        pcVar7 = (this->_longstr)._vals;
        if (uVar3 <= uVar9) {
          uVar5 = uVar9 * 2;
          if (uVar9 * 2 == 0) {
            uVar5 = 4;
          }
          pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar7,(ulong)uVar3,
                                         (ulong)uVar5);
          (this->_longstr)._vals = pcVar7;
          (this->_longstr)._allocated = uVar5;
          uVar9 = (this->_longstr)._size;
        }
        (this->_longstr)._size = uVar9 + 1;
        pcVar7[uVar9] = '\t';
        break;
      case 0x75:
switchD_001365ef_caseD_75:
        ProcessStringHexEscape(this,(SQChar *)local_48,(ulong)(bVar1 != 0x75) * 4 + 4);
        uVar6 = strtoul((char *)local_48,&local_38,0x10);
        AddUTF8(this,uVar6);
        goto LAB_0013648e;
      case 0x76:
        uVar3 = (this->_longstr)._allocated;
        uVar9 = (this->_longstr)._size;
        pcVar7 = (this->_longstr)._vals;
        if (uVar3 <= uVar9) {
          uVar5 = uVar9 * 2;
          if (uVar9 * 2 == 0) {
            uVar5 = 4;
          }
          pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar7,(ulong)uVar3,
                                         (ulong)uVar5);
          (this->_longstr)._vals = pcVar7;
          (this->_longstr)._allocated = uVar5;
          uVar9 = (this->_longstr)._size;
        }
        (this->_longstr)._size = uVar9 + 1;
        pcVar7[uVar9] = '\v';
        break;
      case 0x78:
        ProcessStringHexEscape(this,(SQChar *)&local_38,2);
        uVar6 = strtoul((char *)&local_38,local_48,0x10);
        uVar3 = (this->_longstr)._allocated;
        uVar9 = (this->_longstr)._size;
        pcVar7 = (this->_longstr)._vals;
        if (uVar3 <= uVar9) {
          uVar5 = uVar9 * 2;
          if (uVar9 * 2 == 0) {
            uVar5 = 4;
          }
          pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar7,(ulong)uVar3,
                                         (ulong)uVar5);
          (this->_longstr)._vals = pcVar7;
          (this->_longstr)._allocated = uVar5;
          uVar9 = (this->_longstr)._size;
        }
        (this->_longstr)._size = uVar9 + 1;
        pcVar7[uVar9] = (char)uVar6;
        goto LAB_0013648e;
      case 0x7b:
      case 0x7d:
        if (this->_state != LS_TEMPALTE) goto switchD_001365ef_caseD_6f;
        uVar3 = (this->_longstr)._allocated;
        uVar9 = (this->_longstr)._size;
        pcVar7 = (this->_longstr)._vals;
        if (uVar3 <= uVar9) {
          uVar5 = uVar9 * 2;
          if (uVar9 * 2 == 0) {
            uVar5 = 4;
          }
          pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar7,(ulong)uVar3,
                                         (ulong)uVar5);
          (this->_longstr)._vals = pcVar7;
          (this->_longstr)._allocated = uVar5;
          uVar9 = (this->_longstr)._size;
        }
        (this->_longstr)._size = uVar9 + 1;
        pcVar7[uVar9] = bVar1;
        break;
      default:
        if (bVar1 == 0x62) {
          uVar3 = (this->_longstr)._allocated;
          uVar9 = (this->_longstr)._size;
          pcVar7 = (this->_longstr)._vals;
          if (uVar3 <= uVar9) {
            uVar5 = uVar9 * 2;
            if (uVar9 * 2 == 0) {
              uVar5 = 4;
            }
            pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar7,(ulong)uVar3,
                                           (ulong)uVar5);
            (this->_longstr)._vals = pcVar7;
            (this->_longstr)._allocated = uVar5;
            uVar9 = (this->_longstr)._size;
          }
          (this->_longstr)._size = uVar9 + 1;
          pcVar7[uVar9] = '\b';
        }
        else {
          if (bVar1 != 0x66) goto switchD_001365ef_caseD_6f;
          uVar3 = (this->_longstr)._allocated;
          uVar9 = (this->_longstr)._size;
          pcVar7 = (this->_longstr)._vals;
          if (uVar3 <= uVar9) {
            uVar5 = uVar9 * 2;
            if (uVar9 * 2 == 0) {
              uVar5 = 4;
            }
            pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar7,(ulong)uVar3,
                                           (ulong)uVar5);
            (this->_longstr)._vals = pcVar7;
            (this->_longstr)._allocated = uVar5;
            uVar9 = (this->_longstr)._size;
          }
          (this->_longstr)._size = uVar9 + 1;
          pcVar7[uVar9] = '\f';
        }
      }
    }
LAB_0013645f:
    uVar6 = this->_sourceTextPtr;
    if (uVar6 < this->_sourceTextSize) {
      this->_sourceTextPtr = uVar6 + 1;
      LVar11 = this->_sourceText[uVar6];
    }
    else {
      this->_reached_eof = 1;
      LVar11 = '\0';
    }
    this->_currdata = LVar11;
    this->_currentcolumn = this->_currentcolumn + 1;
    goto LAB_0013648e;
  }
  if ((uVar3 != 0x7b) || (this->_state != LS_TEMPALTE)) {
LAB_00136401:
    uVar3 = (this->_longstr)._allocated;
    uVar9 = (this->_longstr)._size;
    pcVar7 = (this->_longstr)._vals;
    if (uVar3 <= uVar9) {
      uVar5 = uVar9 * 2;
      if (uVar9 * 2 == 0) {
        uVar5 = 4;
      }
      pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar7,(ulong)uVar3,(ulong)uVar5);
      (this->_longstr)._vals = pcVar7;
      (this->_longstr)._allocated = uVar5;
      uVar9 = (this->_longstr)._size;
    }
    (this->_longstr)._size = uVar9 + 1;
    pcVar7[uVar9] = (char)uVar6;
    goto LAB_0013645f;
  }
  uVar3 = (this->_longstr)._allocated;
  uVar9 = (this->_longstr)._size;
  pcVar7 = (this->_longstr)._vals;
  if (uVar3 <= uVar9) {
    SVar10 = 4;
    if (uVar9 * 2 != 0) {
      SVar10 = (SQUnsignedInteger)(uVar9 * 2);
    }
    pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar7,(ulong)uVar3,SVar10);
    (this->_longstr)._vals = pcVar7;
    (this->_longstr)._allocated = (size_type)SVar10;
    uVar9 = (this->_longstr)._size;
  }
  (this->_longstr)._size = uVar9 + 1;
  pcVar7[uVar9] = '{';
  uVar6 = this->_sourceTextPtr;
  if (uVar6 < this->_sourceTextSize) {
    this->_sourceTextPtr = uVar6 + 1;
    LVar11 = this->_sourceText[uVar6];
  }
  else {
    this->_reached_eof = 1;
    LVar11 = '\0';
  }
  this->_currdata = LVar11;
  this->_currentcolumn = this->_currentcolumn + 1;
  SVar12 = this->_expectedToken;
LAB_00136c61:
  uVar3 = (this->_longstr)._allocated;
  uVar9 = (this->_longstr)._size;
  pcVar7 = (this->_longstr)._vals;
  if (uVar3 <= uVar9) {
    SVar10 = 4;
    if (uVar9 * 2 != 0) {
      SVar10 = (SQUnsignedInteger)(uVar9 * 2);
    }
    pcVar7 = (char *)sq_vm_realloc((this->_longstr)._alloc_ctx,pcVar7,(ulong)uVar3,SVar10);
    (this->_longstr)._vals = pcVar7;
    (this->_longstr)._allocated = (size_type)SVar10;
    uVar9 = (this->_longstr)._size;
  }
  (this->_longstr)._size = uVar9 + 1;
  pcVar7[uVar9] = '\0';
  if (ndelim != 0x27) {
    this->_svalue = (this->_longstr)._vals;
    return SVar12;
  }
  sVar4 = (this->_longstr)._size;
  if (sVar4 == 1) {
    diagId = DI_EMPTY_LITERAL;
  }
  else {
    if (sVar4 == 2) goto LAB_00136d0c;
    diagId = DI_TOO_LONG_LITERAL;
  }
  iVar2 = (int)this->_tokencolumn;
  SQCompilation::SQCompilationContext::reportDiagnostic
            (this->_ctx,diagId,(int32_t)this->_tokenline,iVar2,(int)this->_currentcolumn - iVar2);
LAB_00136d0c:
  this->_nvalue = (long)*(this->_longstr)._vals;
  return 0x104;
}

Assistant:

SQInteger SQLexer::ReadString(SQInteger ndelim,bool verbatim, bool advance)
{
    SQInteger t = TK_STRING_LITERAL;
    if (_state == LS_TEMPALTE && ndelim != _SC('\"')) {
        _ctx.reportDiagnostic(DiagnosticsId::DI_EXPECTED_LEX, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "string");
        return -1;
    }
    INIT_TEMP_STRING();
    if (advance)
      NEXT();
    if(IS_EOB()) return -1;
    for(;;) {
        while(CUR_CHAR != ndelim) {
            SQInteger x = CUR_CHAR;
            switch (x) {
            case SQUIRREL_EOB:
                _ctx.reportDiagnostic(DiagnosticsId::DI_UNFINISHED_STRING, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                return -1;
            case _SC('\n'):
                if(!verbatim)
                    _ctx.reportDiagnostic(DiagnosticsId::DI_NEWLINE_IN_CONST, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                APPEND_CHAR(CUR_CHAR); NEXT();
                nextLine();
                break;
            case _SC('\\'):
                if(verbatim) {
                    APPEND_CHAR('\\'); NEXT();
                }
                else {
                    NEXT();
                    switch(CUR_CHAR) {
                    case _SC('x'):  {
                        const SQInteger maxdigits = sizeof(SQChar) * 2;
                        SQChar temp[maxdigits + 1];
                        ProcessStringHexEscape(temp, maxdigits);
                        SQChar *stemp;
                        APPEND_CHAR((SQChar)strtoul(temp, &stemp, 16));
                    }
                    break;
                    case _SC('U'):
                    case _SC('u'):  {
                        const SQInteger maxdigits = CUR_CHAR == 'u' ? 4 : 8;
                        SQChar temp[8 + 1];
                        ProcessStringHexEscape(temp, maxdigits);
                        SQChar *stemp;
                        AddUTF8(strtoul(temp, &stemp, 16));
                    }
                    break;
                    case _SC('t'): APPEND_CHAR(_SC('\t')); NEXT(); break;
                    case _SC('a'): APPEND_CHAR(_SC('\a')); NEXT(); break;
                    case _SC('b'): APPEND_CHAR(_SC('\b')); NEXT(); break;
                    case _SC('n'): APPEND_CHAR(_SC('\n')); NEXT(); break;
                    case _SC('r'): APPEND_CHAR(_SC('\r')); NEXT(); break;
                    case _SC('v'): APPEND_CHAR(_SC('\v')); NEXT(); break;
                    case _SC('f'): APPEND_CHAR(_SC('\f')); NEXT(); break;
                    case _SC('0'): APPEND_CHAR(_SC('\0')); NEXT(); break;
                    case _SC('\\'): APPEND_CHAR(_SC('\\')); NEXT(); break;
                    case _SC('"'): APPEND_CHAR(_SC('"')); NEXT(); break;
                    case _SC('\''): APPEND_CHAR(_SC('\'')); NEXT(); break;
                    case _SC('{'): case _SC('}'):
                        if (_state == LS_TEMPALTE) {
                          APPEND_CHAR(CUR_CHAR);
                          NEXT();
                          break;
                        }
                    // fall through -V796
                    default:
                        _ctx.reportDiagnostic(DiagnosticsId::DI_UNRECOGNISED_ESCAPER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                    break;
                    }
                }
                break;
            case _SC('{'):
                if (_state == LS_TEMPALTE) {
                    APPEND_CHAR(CUR_CHAR);
                    NEXT();
                    assert(_expectedToken > 0);
                    t = _expectedToken;
                    goto loop_exit;
                }
            default:
                APPEND_CHAR(CUR_CHAR);
                NEXT();
            }
        }
        NEXT();

        if (_state == LS_TEMPALTE)
          t = TK_TEMPLATE_SUFFIX;

        if(verbatim && CUR_CHAR == '"') { //double quotation
            APPEND_CHAR(CUR_CHAR);
            NEXT();
        }
        else {
            break;
        }
    }

loop_exit:
    TERMINATE_BUFFER();
    SQInteger len = _longstr.size()-1;
    if(ndelim == _SC('\'')) {
        assert(_state != LS_TEMPALTE);
        if(len == 0)
            _ctx.reportDiagnostic(DiagnosticsId::DI_EMPTY_LITERAL, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
        if(len > 1)
            _ctx.reportDiagnostic(DiagnosticsId::DI_TOO_LONG_LITERAL, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
        _nvalue = _longstr[0];
        return TK_INTEGER;
    }
    SetStringValue();
    return t;
}